

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerReflection::emit_specialization_constants(CompilerReflection *this)

{
  bool bVar1;
  uint32_t uVar2;
  int32_t value;
  element_type *peVar3;
  SpecializationConstant *pSVar4;
  SPIRType *pSVar5;
  string *value_00;
  float value_01;
  allocator local_379;
  string local_378 [39];
  allocator local_351;
  string local_350 [39];
  allocator local_329;
  string local_328 [39];
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [32];
  string local_2b8 [39];
  allocator local_291;
  string local_290 [39];
  allocator local_269;
  string local_268 [32];
  ID local_248;
  allocator local_241;
  string local_240 [32];
  undefined1 local_220 [8];
  SPIRType type;
  SPIRConstant *c;
  SpecializationConstant *spec_const;
  SpecializationConstant *__end1;
  SpecializationConstant *__begin1;
  SmallVector<spirv_cross::SpecializationConstant,_8UL> *__range1;
  allocator local_91;
  string local_90 [36];
  undefined4 local_6c;
  undefined1 local_68 [8];
  SmallVector<spirv_cross::SpecializationConstant,_8UL> specialization_constants;
  CompilerReflection *this_local;
  
  specialization_constants.stack_storage.aligned_char._56_8_ = this;
  Compiler::get_specialization_constants
            ((SmallVector<spirv_cross::SpecializationConstant,_8UL> *)local_68,(Compiler *)this);
  bVar1 = VectorView<spirv_cross::SpecializationConstant>::empty
                    ((VectorView<spirv_cross::SpecializationConstant> *)local_68);
  if (bVar1) {
    local_6c = 1;
  }
  else {
    peVar3 = ::std::
             __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_90,"specialization_constants",&local_91);
    simple_json::Stream::emit_json_key_array(peVar3,(string *)local_90);
    ::std::__cxx11::string::~string(local_90);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
    __end1 = VectorView<spirv_cross::SpecializationConstant>::begin
                       ((VectorView<spirv_cross::SpecializationConstant> *)local_68);
    pSVar4 = VectorView<spirv_cross::SpecializationConstant>::end
                       ((VectorView<spirv_cross::SpecializationConstant> *)local_68);
    for (; __end1 != pSVar4; __end1 = __end1 + 1) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
      type.member_name_cache._M_h._M_single_bucket =
           (__node_base_ptr)Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,uVar2);
      uVar2 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)
                         &(((SPIRConstant *)type.member_name_cache._M_h._M_single_bucket)->
                          super_IVariant).field_0xc);
      pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
      SPIRType::SPIRType((SPIRType *)local_220,pSVar5);
      peVar3 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      simple_json::Stream::begin_json_object(peVar3);
      peVar3 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_240,"name",&local_241);
      TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)3>(&local_248,&__end1->id);
      value_00 = Compiler::get_name_abi_cxx11_((Compiler *)this,local_248);
      simple_json::Stream::emit_json_key_value(peVar3,(string *)local_240,value_00);
      ::std::__cxx11::string::~string(local_240);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_241);
      peVar3 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_268,"id",&local_269);
      simple_json::Stream::emit_json_key_value(peVar3,(string *)local_268,__end1->constant_id);
      ::std::__cxx11::string::~string(local_268);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_269);
      peVar3 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_290,"type",&local_291);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_2b8,this,local_220,0);
      simple_json::Stream::emit_json_key_value(peVar3,(string *)local_290,local_2b8);
      ::std::__cxx11::string::~string((string *)local_2b8);
      ::std::__cxx11::string::~string(local_290);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_291);
      peVar3 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2d8,"variable_id",&local_2d9);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
      simple_json::Stream::emit_json_key_value(peVar3,(string *)local_2d8,uVar2);
      ::std::__cxx11::string::~string(local_2d8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      switch(type.super_IVariant._vptr_IVariant._4_4_) {
      case 2:
        peVar3 = ::std::
                 __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->json_stream);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_378,"default_value",&local_379);
        uVar2 = SPIRConstant::scalar
                          ((SPIRConstant *)type.member_name_cache._M_h._M_single_bucket,0,0);
        simple_json::Stream::emit_json_key_value(peVar3,(string *)local_378,uVar2 != 0);
        ::std::__cxx11::string::~string(local_378);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_379);
        break;
      default:
        break;
      case 7:
        peVar3 = ::std::
                 __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->json_stream);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_328,"default_value",&local_329);
        value = SPIRConstant::scalar_i32
                          ((SPIRConstant *)type.member_name_cache._M_h._M_single_bucket,0,0);
        simple_json::Stream::emit_json_key_value(peVar3,(string *)local_328,value);
        ::std::__cxx11::string::~string(local_328);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_329);
        break;
      case 8:
        peVar3 = ::std::
                 __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->json_stream);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_300,"default_value",&local_301);
        uVar2 = SPIRConstant::scalar
                          ((SPIRConstant *)type.member_name_cache._M_h._M_single_bucket,0,0);
        simple_json::Stream::emit_json_key_value(peVar3,(string *)local_300,uVar2);
        ::std::__cxx11::string::~string(local_300);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_301);
        break;
      case 0xd:
        peVar3 = ::std::
                 __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->json_stream);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_350,"default_value",&local_351);
        value_01 = SPIRConstant::scalar_f32
                             ((SPIRConstant *)type.member_name_cache._M_h._M_single_bucket,0,0);
        simple_json::Stream::emit_json_key_value(peVar3,(string *)local_350,value_01);
        ::std::__cxx11::string::~string(local_350);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_351);
      }
      peVar3 = ::std::
               __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->json_stream);
      simple_json::Stream::end_json_object(peVar3);
      SPIRType::~SPIRType((SPIRType *)local_220);
    }
    peVar3 = ::std::
             __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
    simple_json::Stream::end_json_array(peVar3);
    local_6c = 0;
  }
  SmallVector<spirv_cross::SpecializationConstant,_8UL>::~SmallVector
            ((SmallVector<spirv_cross::SpecializationConstant,_8UL> *)local_68);
  return;
}

Assistant:

void CompilerReflection::emit_specialization_constants()
{
	auto specialization_constants = get_specialization_constants();
	if (specialization_constants.empty())
		return;

	json_stream->emit_json_key_array("specialization_constants");
	for (const auto &spec_const : specialization_constants)
	{
		auto &c = get<SPIRConstant>(spec_const.id);
		auto type = get<SPIRType>(c.constant_type);
		json_stream->begin_json_object();
		json_stream->emit_json_key_value("name", get_name(spec_const.id));
		json_stream->emit_json_key_value("id", spec_const.constant_id);
		json_stream->emit_json_key_value("type", type_to_glsl(type));
		json_stream->emit_json_key_value("variable_id", spec_const.id);
		switch (type.basetype)
		{
		case SPIRType::UInt:
			json_stream->emit_json_key_value("default_value", c.scalar());
			break;

		case SPIRType::Int:
			json_stream->emit_json_key_value("default_value", c.scalar_i32());
			break;

		case SPIRType::Float:
			json_stream->emit_json_key_value("default_value", c.scalar_f32());
			break;

		case SPIRType::Boolean:
			json_stream->emit_json_key_value("default_value", c.scalar() != 0);
			break;

		default:
			break;
		}
		json_stream->end_json_object();
	}
	json_stream->end_json_array();
}